

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-c.cpp
# Opt level: O3

duckdb_data_chunk duckdb_stream_fetch_chunk(duckdb_result result)

{
  pointer pQVar1;
  duckdb_data_chunk p_Var2;
  
  if (result.deprecated_error_message != (char *)0x0) {
    pQVar1 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)result.deprecated_error_message);
    if ((pQVar1->super_BaseQueryResult).type == STREAM_RESULT) {
      p_Var2 = duckdb_fetch_chunk(result);
      return p_Var2;
    }
  }
  return (duckdb_data_chunk)0x0;
}

Assistant:

duckdb_data_chunk duckdb_stream_fetch_chunk(duckdb_result result) {
	if (!result.internal_data) {
		return nullptr;
	}
	auto &result_data = *((duckdb::DuckDBResultData *)result.internal_data);
	if (result_data.result->type != duckdb::QueryResultType::STREAM_RESULT) {
		// We can only fetch from a StreamQueryResult
		return nullptr;
	}
	return duckdb_fetch_chunk(result);
}